

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module.cpp
# Opt level: O2

void __thiscall sc_core::sc_module::sc_module(sc_module *this,sc_module_name *param_1)

{
  sc_simcontext *psVar1;
  sc_module_name *psVar2;
  char *nm;
  
  psVar1 = sc_get_curr_simcontext();
  psVar2 = sc_object_manager::top_of_module_name_stack(psVar1->m_object_manager);
  nm = sc_module_name::operator_cast_to_char_(psVar2);
  sc_object::sc_object(&this->super_sc_object,nm);
  (this->super_sc_object)._vptr_sc_object = (_func_int **)&PTR_print_00263de0;
  (this->super_sc_process_host)._vptr_sc_process_host = (_func_int **)&PTR__sc_module_00263e88;
  sc_sensitive::sc_sensitive(&this->sensitive,this);
  sc_sensitive_pos::sc_sensitive_pos(&this->sensitive_pos,this);
  sc_sensitive_neg::sc_sensitive_neg(&this->sensitive_neg,this);
  this->m_end_module_called = false;
  this->m_port_vec =
       (vector<sc_core::sc_port_base_*,_std::allocator<sc_core::sc_port_base_*>_> *)0x0;
  this->m_port_index = 0;
  this->m_name_gen = (sc_name_gen *)0x0;
  this->m_module_name_p = (sc_module_name *)0x0;
  psVar2 = sc_object_manager::top_of_module_name_stack
                     (((this->super_sc_object).m_simc)->m_object_manager);
  if ((psVar2 != (sc_module_name *)0x0) && (psVar2->m_module_p == (sc_module *)0x0)) {
    sc_module_init(this);
    psVar2->m_module_p = this;
    this->m_module_name_p = psVar2;
    return;
  }
  sc_report_handler::report
            (SC_ERROR,"an sc_module_name parameter for your constructor is required",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_module.cpp"
             ,0xdf);
  sc_abort();
}

Assistant:

sc_module::sc_module( const sc_module_name& )
: sc_object(::sc_core::sc_get_curr_simcontext()
                  ->get_object_manager()
                  ->top_of_module_name_stack()
                  ->operator const char*()),
  sensitive(this),
  sensitive_pos(this),
  sensitive_neg(this),
  m_end_module_called(false),
  m_port_vec(),
  m_port_index(0),
  m_name_gen(0),
  m_module_name_p(0)
{
    /* For those used to the old style of passing a name to sc_module,
       this constructor will reduce the chance of making a mistake */

    /* When this form is used, we better have a fresh sc_module_name
       on the top of the stack */
    sc_module_name* mod_name = 
        simcontext()->get_object_manager()->top_of_module_name_stack();
    if (0 == mod_name || 0 != mod_name->m_module_p) {
        SC_REPORT_ERROR( SC_ID_SC_MODULE_NAME_REQUIRED_, 0 );
        sc_abort(); // can't recover from here
    }
    sc_module_init();
    mod_name->set_module( this );
    m_module_name_p = mod_name; // must come after sc_module_init call.
}